

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto_focus.cpp
# Opt level: O3

void __thiscall
r_exec::AutoFocusController::inject_input(AutoFocusController *this,View *input,uint64_t start)

{
  Group *this_00;
  uint32_t uVar1;
  ulong uVar2;
  View *this_01;
  long lVar3;
  _Mem *this_02;
  pointer ppGVar4;
  uint uVar5;
  float fVar6;
  Atom local_54 [4];
  Group *local_50;
  View *local_48;
  double local_40;
  double local_38;
  
  local_48 = input;
  local_50 = r_exec::View::get_host(input);
  uVar2 = start & 0xffff;
  ppGVar4 = (this->output_groups).
            super__Vector_base<r_exec::Group_*,_std::allocator<r_exec::Group_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (uVar2 < (ulong)((long)(this->output_groups).
                            super__Vector_base<r_exec::Group_*,_std::allocator<r_exec::Group_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)ppGVar4 >> 3)) {
    uVar5 = (uint)start;
    do {
      uVar5 = uVar5 + 1;
      this_00 = ppGVar4[uVar2];
      this_01 = (View *)operator_new(0x100);
      r_exec::View::View(this_01,local_48,true);
      (this_01->super_View).references[0] = (Code *)this_00;
      fVar6 = (float)r_code::Atom::asFloat();
      local_38 = (double)fVar6;
      uVar1 = Group::get_upr(local_50);
      local_40 = (double)uVar1;
      uVar1 = Group::get_upr(this_00);
      lVar3 = r_code::Utils::GetGroupResilience(local_38,local_40,(double)uVar1);
      r_code::Atom::Float((float)lVar3);
      r_code::Atom::operator=((Atom *)&(this_01->super_View).field_0x38,local_54);
      r_code::Atom::~Atom(local_54);
      this_02 = (_Mem *)r_code::Mem::Get();
      _Mem::inject(this_02,this_01);
      uVar2 = (ulong)(uVar5 & 0xffff);
      ppGVar4 = (this->output_groups).
                super__Vector_base<r_exec::Group_*,_std::allocator<r_exec::Group_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar2 < (ulong)((long)(this->output_groups).
                                   super__Vector_base<r_exec::Group_*,_std::allocator<r_exec::Group_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppGVar4 >> 3))
    ;
  }
  return;
}

Assistant:

inline void AutoFocusController::inject_input(View *input, uint64_t start)
{
    Group *origin = input->get_host();

    for (uint16_t i = start; i < output_groups.size(); ++i) {
        Group *output_group = output_groups[i];
        View *view = new View(input, true);
        view->references[0] = output_group;
        view->code(VIEW_RES) = Atom::Float(Utils::GetGroupResilience(view->code(VIEW_RES).asFloat(), origin->get_upr(), output_group->get_upr()));
        _Mem::Get()->inject(view);
    }
}